

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2cp.c
# Opt level: O2

void i2cp_state_init(i2cp_state *st,i2cp_write_handler h,void *impl)

{
  if (st == (i2cp_state *)0x0) {
    __assert_fail("st",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/majestrate[P]trans2p/src/i2cp.c"
                  ,0xc0,"void i2cp_state_init(struct i2cp_state *, i2cp_write_handler, void *)");
  }
  if (h != (i2cp_write_handler)0x0) {
    if (impl != (void *)0x0) {
      st->write = h;
      st->sid = 0;
      st->sentinit = false;
      st->writeimpl = impl;
      (st->writebuf).sz = 0;
      (st->writebuf).idx = 0;
      memset(st->handlers,0,0x1000);
      memset(&st->readcur,0,0x10008);
      return;
    }
    __assert_fail("impl",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/majestrate[P]trans2p/src/i2cp.c"
                  ,0xc2,"void i2cp_state_init(struct i2cp_state *, i2cp_write_handler, void *)");
  }
  __assert_fail("h",
                "/workspace/llm4binary/github/license_all_cmakelists_25/majestrate[P]trans2p/src/i2cp.c"
                ,0xc1,"void i2cp_state_init(struct i2cp_state *, i2cp_write_handler, void *)");
}

Assistant:

void i2cp_state_init(struct i2cp_state * st, i2cp_write_handler h, void * impl)
{
  assert(st);
  assert(h);
  assert(impl);
  st->write = h;
  st->sid = 0;
  st->sentinit = false;
  st->writeimpl = impl;
  st->readcur.sz = 0;
  memset(st->readcur.buf, 0, sizeof(st->readcur.buf));
  i2cp_ringbuf_init(&st->readbuf);
  i2cp_ringbuf_init(&st->writebuf);
  memset(st->handlers, 0, sizeof(st->handlers));
}